

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

optional<_khr_df_primaries_e> __thiscall
ktx::OptionsCreate::parseColorPrimaries
          (OptionsCreate *this,ParseResult *args,char *argName,Reporter *report)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>
  __l;
  bool bVar1;
  int iVar2;
  OptionValue *this_00;
  size_t sVar3;
  Reporter *this_01;
  long lVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_true>
  this_02;
  const_iterator it;
  string prefixStr;
  string primariesStr;
  optional<_khr_df_primaries_e> result;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
  *in_stack_fffffffffffffb58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb68;
  hasher *in_stack_fffffffffffffb70;
  size_type in_stack_fffffffffffffb78;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
  *in_stack_fffffffffffffb80;
  iterator in_stack_fffffffffffffb88;
  string *option;
  ParseResult *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  OptionValue *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  char **in_stack_fffffffffffffbc8;
  allocator<char> *args_00;
  undefined1 ***local_3c8;
  undefined1 local_3b1 [33];
  _Optional_payload_base<_khr_df_primaries_e> local_390;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_true>
  local_388;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_true>
  local_380;
  char **local_378;
  undefined8 local_370;
  char *local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [32];
  string local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator<char> local_2b1;
  string local_2b0 [33];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
  local_28f;
  undefined4 local_24c;
  undefined8 **local_248;
  undefined1 **local_240 [5];
  undefined1 local_218 [40];
  undefined1 local_1f0 [40];
  undefined1 local_1c8 [40];
  undefined1 local_1a0 [40];
  undefined1 local_178 [40];
  undefined1 local_150 [40];
  undefined1 local_128 [40];
  undefined1 local_100 [40];
  undefined1 local_d8 [40];
  undefined1 local_b0 [40];
  undefined1 local_88 [40];
  undefined1 local_60 [40];
  undefined8 **local_38;
  undefined8 local_30;
  _Optional_payload_base<_khr_df_primaries_e> local_8;
  
  if (parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::values_abi_cxx11_ ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)
                                 ::values_abi_cxx11_);
    if (iVar2 != 0) {
      local_248 = local_240;
      local_24c = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [5])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_218;
      local_28f._M_h._47_4_ = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[6],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [6])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_1f0;
      local_28f._M_h._M_rehash_policy._M_next_resize._3_4_ = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [5])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_1c8;
      local_28f._M_h._M_rehash_policy._7_4_ = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[10],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [10])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_1a0;
      local_28f._M_h._M_rehash_policy._3_4_ = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[12],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [12])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_178;
      local_28f._M_h._31_4_ = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [7])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_150;
      local_28f._M_h._M_element_count._3_4_ = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [7])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_128;
      local_28f._M_h._23_4_ = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [5])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_100;
      local_28f._M_h._M_before_begin._M_nxt._3_4_ = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [7])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_d8;
      local_28f._M_h._15_4_ = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[9],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [9])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_b0;
      local_28f._M_h._M_bucket_count._3_4_ = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [7])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_88;
      local_28f._M_h._7_4_ = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[10],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [10])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_248 = (undefined8 **)local_60;
      local_28f._M_h._M_buckets._3_4_ = 0xb;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
      ::pair<const_char_(&)[9],__khr_df_primaries_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                  *)in_stack_fffffffffffffb90,(char (*) [9])in_stack_fffffffffffffb88,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb80);
      local_38 = local_240;
      local_30 = 0xd;
      in_stack_fffffffffffffb58 = &local_28f;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>
                   *)0x22d6d7);
      __l._M_len = (size_type)in_stack_fffffffffffffb90;
      __l._M_array = in_stack_fffffffffffffb88;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
      ::unordered_map(in_stack_fffffffffffffb80,__l,in_stack_fffffffffffffb78,
                      in_stack_fffffffffffffb70,(key_equal *)in_stack_fffffffffffffb68,
                      (allocator_type *)in_stack_fffffffffffffba0);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>
                    *)0x22d724);
      local_3c8 = (undefined1 ***)&local_38;
      do {
        local_3c8 = local_3c8 + -5;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
                 *)0x22d75b);
      } while (local_3c8 != local_240);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
                   ::~unordered_map,
                   &parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                    values_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                           values_abi_cxx11_);
    }
  }
  std::optional<_khr_df_primaries_e>::optional((optional<_khr_df_primaries_e> *)0x22d7ab);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (allocator<char> *)in_stack_fffffffffffffb90);
  this_00 = cxxopts::ParseResult::operator[]
                      (in_stack_fffffffffffffb90,&in_stack_fffffffffffffb88->first);
  sVar3 = cxxopts::OptionValue::count(this_00);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  if (sVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
               (allocator<char> *)in_stack_fffffffffffffb90);
    cxxopts::ParseResult::operator[](in_stack_fffffffffffffb90,&in_stack_fffffffffffffb88->first);
    this_01 = (Reporter *)cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffffbb0);
    std::__cxx11::string::string(local_2f8,(string *)this_01);
    to_upper_copy(in_stack_fffffffffffffb68);
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator(&local_319);
    args_00 = &local_341;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
               (allocator<char> *)in_stack_fffffffffffffb90);
    std::allocator<char>::~allocator(&local_341);
    lVar4 = std::__cxx11::string::find((string *)&local_2d8,(ulong)local_340);
    if (lVar4 == 0) {
      in_stack_fffffffffffffbc0 = &local_2d8;
      local_358 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffffb60,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffb58);
      local_370 = std::__cxx11::string::begin();
      std::__cxx11::string::size();
      local_368 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_stack_fffffffffffffb68,
                                      (difference_type)in_stack_fffffffffffffb60);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffffb60,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffb58);
      in_stack_fffffffffffffbc8 =
           (char **)std::__cxx11::string::erase(in_stack_fffffffffffffbc0,local_350,local_360);
      local_378 = in_stack_fffffffffffffbc8;
    }
    this_02._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
         ::find(in_stack_fffffffffffffb58,(key_type *)0x22dc1e);
    local_380._M_cur = this_02._M_cur;
    local_388._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
         ::end(in_stack_fffffffffffffb58);
    bVar1 = std::__detail::operator!=(&local_380,&local_388);
    if (bVar1) {
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_false,_true>
                    *)0x22dc6e);
      std::optional<_khr_df_primaries_e>::optional<const__khr_df_primaries_e_&,_true>
                ((optional<_khr_df_primaries_e> *)in_stack_fffffffffffffb60,
                 (_khr_df_primaries_e *)in_stack_fffffffffffffb58);
      local_8 = local_390;
    }
    else {
      option = (string *)local_3b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (allocator<char> *)this_02._M_cur);
      cxxopts::ParseResult::operator[]((ParseResult *)this_02._M_cur,option);
      cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffffbb0);
      Reporter::fatal_usage<char_const(&)[67],char_const*&,std::__cxx11::string_const&>
                (this_01,(char (*) [67])args_00,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
      ;
      std::__cxx11::string::~string((string *)(local_3b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_3b1);
    }
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  return (optional<_khr_df_primaries_e>)local_8;
}

Assistant:

std::optional<khr_df_primaries_e> parseColorPrimaries(cxxopts::ParseResult& args, const char* argName, Reporter& report) const {
        static const std::unordered_map<std::string, khr_df_primaries_e> values{
            { "NONE", KHR_DF_PRIMARIES_UNSPECIFIED },
            { "BT709", KHR_DF_PRIMARIES_BT709 },
            { "SRGB", KHR_DF_PRIMARIES_SRGB },
            { "BT601_EBU", KHR_DF_PRIMARIES_BT601_EBU },
            { "BT601_SMPTE", KHR_DF_PRIMARIES_BT601_SMPTE },
            { "BT2020", KHR_DF_PRIMARIES_BT2020 },
            { "CIEXYZ", KHR_DF_PRIMARIES_CIEXYZ },
            { "ACES", KHR_DF_PRIMARIES_ACES },
            { "ACESCC", KHR_DF_PRIMARIES_ACESCC },
            { "NTSC1953", KHR_DF_PRIMARIES_NTSC1953 },
            { "PAL525", KHR_DF_PRIMARIES_PAL525 },
            { "DISPLAYP3", KHR_DF_PRIMARIES_DISPLAYP3 },
            { "ADOBERGB", KHR_DF_PRIMARIES_ADOBERGB },
        };

        std::optional<khr_df_primaries_e> result = {};

        if (args[argName].count()) {
            auto primariesStr = to_upper_copy(args[argName].as<std::string>());
            const std::string prefixStr = "KHR_DF_PRIMARIES_";
            if (primariesStr.find(prefixStr) == 0) {
                primariesStr.erase(primariesStr.begin(),
                                   primariesStr.begin() + prefixStr.size());
            }
            const auto it = values.find(primariesStr);
            if (it != values.end()) {
                result = it->second;
            } else {
                report.fatal_usage("Invalid or unsupported primaries specified as --{} argument: \"{}\".", argName,
                                   args[argName].as<std::string>());
            }
        }

        return result;
    }